

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

int gen_iwmmxt_shift(TCGContext_conflict1 *tcg_ctx,uint32_t insn,uint32_t mask,TCGv_i32 dest)

{
  uint reg;
  TCGv_i32 local_38;
  TCGv_i32 tmp;
  int rd;
  TCGv_i32 dest_local;
  uint32_t mask_local;
  uint32_t insn_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  reg = insn & 0xf;
  if ((insn & 0x100) == 0) {
    local_38 = tcg_temp_new_i32(tcg_ctx);
    iwmmxt_load_reg(tcg_ctx,tcg_ctx->cpu_V0,reg);
    tcg_gen_extrl_i64_i32_aarch64(tcg_ctx,local_38,tcg_ctx->cpu_V0);
  }
  else {
    if ((reg < 8) || (0xb < reg)) {
      return 1;
    }
    local_38 = iwmmxt_load_creg(tcg_ctx,reg);
  }
  tcg_gen_andi_i32_aarch64(tcg_ctx,local_38,local_38,mask);
  tcg_gen_mov_i32(tcg_ctx,dest,local_38);
  tcg_temp_free_i32(tcg_ctx,local_38);
  return 0;
}

Assistant:

static inline int gen_iwmmxt_shift(TCGContext *tcg_ctx, uint32_t insn, uint32_t mask, TCGv_i32 dest)
{
    int rd = (insn >> 0) & 0xf;
    TCGv_i32 tmp;

    if (insn & (1 << 8)) {
        if (rd < ARM_IWMMXT_wCGR0 || rd > ARM_IWMMXT_wCGR3) {
            return 1;
        } else {
            tmp = iwmmxt_load_creg(tcg_ctx, rd);
        }
    } else {
        tmp = tcg_temp_new_i32(tcg_ctx);
        iwmmxt_load_reg(tcg_ctx, tcg_ctx->cpu_V0, rd);
        tcg_gen_extrl_i64_i32(tcg_ctx, tmp, tcg_ctx->cpu_V0);
    }
    tcg_gen_andi_i32(tcg_ctx, tmp, tmp, mask);
    tcg_gen_mov_i32(tcg_ctx, dest, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);
    return 0;
}